

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

bool __thiscall util::fs::File::operator<(File *this,File *rhs)

{
  bool bVar1;
  
  if (this->is_dir == true) {
    if (rhs->is_dir == false) {
      return true;
    }
  }
  else if (rhs->is_dir != false) {
    return false;
  }
  bVar1 = std::operator<(&this->path,&rhs->path);
  if (!bVar1) {
    bVar1 = std::operator<(&rhs->path,&this->path);
    if (bVar1) {
      return false;
    }
    bVar1 = std::operator<(&this->name,&rhs->name);
    return bVar1;
  }
  return true;
}

Assistant:

bool
File::operator< (File const& rhs) const
{
    if (this->is_dir && !rhs.is_dir)
        return true;
    else if (!this->is_dir && rhs.is_dir)
        return false;
    else if (this->path < rhs.path)
        return true;
    else if (rhs.path < this->path)
        return false;
    else
        return (this->name < rhs.name);
}